

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createInstanceTest(TestStatus *__return_storage_ptr__,Context *context)

{
  RefData<vk::VkInstance_s_*> data;
  qpTestResult code;
  TestContext *this;
  TestLog *log_00;
  VkApplicationInfo *pVVar1;
  MessageBuilder *pMVar2;
  string local_6f0 [3];
  Error *err;
  Move<vk::VkInstance_s_*> local_500;
  RefData<vk::VkInstance_s_*> local_4e8;
  undefined1 local_4d0 [8];
  Unique<vk::VkInstance_s_*> instance;
  undefined1 auStack_338 [8];
  VkInstanceCreateInfo instanceCreateInfo;
  VkApplicationInfo *appInfo_6;
  size_t appInfoNdx;
  VkApplicationInfo appInfo_5;
  undefined1 local_2b0 [8];
  VkApplicationInfo appInfo_4;
  undefined1 local_278 [4];
  int patchVersion;
  VkApplicationInfo appInfo_3;
  undefined1 local_240 [4];
  int engineVersionNdx;
  VkApplicationInfo appInfo_2;
  undefined1 local_208 [4];
  int appVersionNdx;
  VkApplicationInfo appInfo_1;
  undefined1 local_1d0 [4];
  int engineNameNdx;
  VkApplicationInfo appInfo;
  undefined1 local_198 [4];
  int appNameNdx;
  vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> appInfos;
  PlatformInterface *platformInterface;
  deUint32 engineVersions [3];
  deUint32 appVersions [3];
  int patchNumbers [9];
  char *engineNames [8];
  char *appNames [8];
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  ResultCollector resultCollector;
  TestLog *log;
  Context *context_local;
  
  this = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(this);
  resultCollector.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_70,log_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  engineNames[7] = "appName";
  engineNames[5] = "engine\nName";
  engineNames[6] = "engine\r\nName";
  engineNames[3] = "engine\"(name)";
  engineNames[4] = "eng~!@#$%^&*()_+name";
  engineNames[1] = "";
  engineNames[2] = "engine. name";
  engineNames[0] = (char *)0x0;
  stack0xfffffffffffffea8 = 0x100000000;
  stack0xfffffffffffffe98 = 0x100000000;
  appVersions[0] = 0xffffffff;
  engineVersions[0] = 0xffffffff;
  appInfos.super__Vector_base<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)Context::getPlatformInterface(context);
  std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::vector
            ((vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> *)local_198);
  for (appInfo.apiVersion = 0; (int)appInfo.apiVersion < 8;
      appInfo.apiVersion = appInfo.apiVersion + 1) {
    local_1d0 = (undefined1  [4])0x0;
    appInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    appInfo._4_4_ = 0;
    appInfo.pNext = engineNames[(long)(int)appInfo.apiVersion + 7];
    appInfo.pApplicationName._0_4_ = 0;
    appInfo._24_8_ = anon_var_dwarf_149598;
    appInfo.pEngineName._0_4_ = 0;
    appInfo.pEngineName._4_4_ = 0x400000;
    std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::push_back
              ((vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> *)local_198,
               (value_type *)local_1d0);
  }
  for (appInfo_1.apiVersion = 0; (int)appInfo_1.apiVersion < 8;
      appInfo_1.apiVersion = appInfo_1.apiVersion + 1) {
    local_208 = (undefined1  [4])0x0;
    appInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    appInfo_1._4_4_ = 0;
    appInfo_1.pNext = anon_var_dwarf_149520;
    appInfo_1.pApplicationName._0_4_ = 0;
    appInfo_1._24_8_ = engineNames[(long)(int)appInfo_1.apiVersion + -1];
    appInfo_1.pEngineName._0_4_ = 0;
    appInfo_1.pEngineName._4_4_ = 0x400000;
    std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::push_back
              ((vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> *)local_198,
               (value_type *)local_208);
  }
  for (appInfo_2.apiVersion = 0; (int)appInfo_2.apiVersion < 3;
      appInfo_2.apiVersion = appInfo_2.apiVersion + 1) {
    local_240 = (undefined1  [4])0x0;
    appInfo_2.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    appInfo_2._4_4_ = 0;
    appInfo_2.pNext = anon_var_dwarf_149520;
    appInfo_2.pApplicationName._0_4_ = engineVersions[(long)(int)appInfo_2.apiVersion + 2];
    appInfo_2._24_8_ = anon_var_dwarf_149598;
    appInfo_2.pEngineName._0_4_ = 0;
    appInfo_2.pEngineName._4_4_ = 0x400000;
    std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::push_back
              ((vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> *)local_198,
               (value_type *)local_240);
  }
  for (appInfo_3.apiVersion = 0; (int)appInfo_3.apiVersion < 3;
      appInfo_3.apiVersion = appInfo_3.apiVersion + 1) {
    local_278 = (undefined1  [4])0x0;
    appInfo_3.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    appInfo_3._4_4_ = 0;
    appInfo_3.pNext = anon_var_dwarf_149520;
    appInfo_3.pApplicationName._0_4_ = 0;
    appInfo_3._24_8_ = anon_var_dwarf_149598;
    appInfo_3.pEngineName._0_4_ = engineVersions[(long)(int)appInfo_3.apiVersion + -2];
    appInfo_3.pEngineName._4_4_ = 0x400000;
    std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::push_back
              ((vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> *)local_198,
               (value_type *)local_278);
  }
  for (appInfo_4.apiVersion = 0; (int)appInfo_4.apiVersion < 9;
      appInfo_4.apiVersion = appInfo_4.apiVersion + 1) {
    local_2b0._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    appInfo_4.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    appInfo_4._4_4_ = 0;
    appInfo_4.pNext = anon_var_dwarf_149520;
    appInfo_4.pApplicationName._0_4_ = 0;
    appInfo_4._24_8_ = anon_var_dwarf_149598;
    appInfo_4.pEngineName._0_4_ = 0;
    appInfo_4.pEngineName._4_4_ = appVersions[(long)(int)appInfo_4.apiVersion + 2] | 0x400000;
    std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::push_back
              ((vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> *)local_198,
               (value_type *)local_2b0);
  }
  appInfo_5._24_8_ = anon_var_dwarf_149598;
  appInfo_5.pEngineName = (char *)0x0;
  appInfo_5.pNext = anon_var_dwarf_149520;
  appInfo_5.pApplicationName = (char *)0x0;
  appInfoNdx = 0;
  appInfo_5.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  appInfo_5._4_4_ = 0;
  std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::push_back
            ((vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> *)local_198,
             (value_type *)&appInfoNdx);
  appInfo_6 = (VkApplicationInfo *)0x0;
  while( true ) {
    pVVar1 = (VkApplicationInfo *)
             std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::size
                       ((vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> *)
                        local_198);
    if (pVVar1 <= appInfo_6) break;
    instanceCreateInfo._16_8_ =
         std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::operator[]
                   ((vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> *)
                    local_198,(size_type)appInfo_6);
    instanceCreateInfo.ppEnabledLayerNames = (char **)0x0;
    instanceCreateInfo.enabledExtensionCount = 0;
    instanceCreateInfo._52_4_ = 0;
    instanceCreateInfo.pApplicationInfo = (VkApplicationInfo *)0x0;
    instanceCreateInfo.enabledLayerCount = 0;
    instanceCreateInfo._36_4_ = 0;
    instanceCreateInfo.pNext = (void *)0x0;
    instanceCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    instanceCreateInfo._4_4_ = 0;
    auStack_338 = (undefined1  [8])0x1;
    instanceCreateInfo.ppEnabledExtensionNames = (char **)instanceCreateInfo._16_8_;
    tcu::TestLog::operator<<
              ((MessageBuilder *)
               &instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
               (TestLog *)resultCollector.m_message.field_2._8_8_,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)
                        &instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
                        (char (*) [33])"Creating instance with appInfo: ");
    pMVar2 = tcu::MessageBuilder::operator<<
                       (pMVar2,(VkApplicationInfo *)instanceCreateInfo.ppEnabledExtensionNames);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder
              ((MessageBuilder *)
               &instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
    ::vk::createInstance
              (&local_500,
               (PlatformInterface *)
               appInfos.
               super__Vector_base<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,(VkInstanceCreateInfo *)auStack_338
               ,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_4e8,(Move *)&local_500);
    data.deleter.m_destroyInstance = local_4e8.deleter.m_destroyInstance;
    data.object = local_4e8.object;
    data.deleter.m_allocator = local_4e8.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique
              ((Unique<vk::VkInstance_s_*> *)local_4d0,data);
    ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_500);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&err,(TestLog *)resultCollector.m_message.field_2._8_8_,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<((MessageBuilder *)&err,(char (*) [10])"Succeeded");
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&err);
    ::vk::refdetails::Unique<vk::VkInstance_s_*>::~Unique((Unique<vk::VkInstance_s_*> *)local_4d0);
    appInfo_6 = (VkApplicationInfo *)((long)&appInfo_6->sType + 1);
  }
  code = tcu::ResultCollector::getResult((ResultCollector *)local_70);
  tcu::ResultCollector::getMessage_abi_cxx11_(local_6f0,(ResultCollector *)local_70);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,local_6f0);
  std::__cxx11::string::~string((string *)local_6f0);
  std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::~vector
            ((vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> *)local_198);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createInstanceTest (Context& context)
{
	tcu::TestLog&				log						= context.getTestContext().getLog();
	tcu::ResultCollector		resultCollector			(log);
	const char*					appNames[]				= { "appName", DE_NULL, "",  "app, name", "app(\"name\"", "app~!@#$%^&*()_+name", "app\nName", "app\r\nName" };
	const char*					engineNames[]			= { "engineName", DE_NULL, "",  "engine. name", "engine\"(name)", "eng~!@#$%^&*()_+name", "engine\nName", "engine\r\nName" };
	const int                   patchNumbers[]          = { 0, 1, 2, 3, 4, 5, 13, 4094, 4095 };
	const deUint32				appVersions[]			= { 0, 1, (deUint32)-1 };
	const deUint32				engineVersions[]		= { 0, 1, (deUint32)-1 };
	const PlatformInterface&	platformInterface		= context.getPlatformInterface();
	vector<VkApplicationInfo>	appInfos;

	// test over appName
	for (int appNameNdx = 0; appNameNdx < DE_LENGTH_OF_ARRAY(appNames); appNameNdx++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			appNames[appNameNdx],					// const char*					pAppName;
			0u,										// deUint32						appVersion;
			"engineName",							// const char*					pEngineName;
			0u,										// deUint32						engineVersion;
			VK_API_VERSION,							// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// test over engineName
	for (int engineNameNdx = 0; engineNameNdx < DE_LENGTH_OF_ARRAY(engineNames); engineNameNdx++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			"appName",								// const char*					pAppName;
			0u,										// deUint32						appVersion;
			engineNames[engineNameNdx],				// const char*					pEngineName;
			0u,										// deUint32						engineVersion;
			VK_API_VERSION,							// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// test over appVersion
	for (int appVersionNdx = 0; appVersionNdx < DE_LENGTH_OF_ARRAY(appVersions); appVersionNdx++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			"appName",								// const char*					pAppName;
			appVersions[appVersionNdx],				// deUint32						appVersion;
			"engineName",							// const char*					pEngineName;
			0u,										// deUint32						engineVersion;
			VK_API_VERSION,							// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// test over engineVersion
	for (int engineVersionNdx = 0; engineVersionNdx < DE_LENGTH_OF_ARRAY(engineVersions); engineVersionNdx++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			"appName",								// const char*					pAppName;
			0u,										// deUint32						appVersion;
			"engineName",							// const char*					pEngineName;
			engineVersions[engineVersionNdx],		// deUint32						engineVersion;
			VK_API_VERSION,							// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}
	// patch component of api version checking (should be ignored by implementation)
	for (int patchVersion = 0; patchVersion < DE_LENGTH_OF_ARRAY(patchNumbers); patchVersion++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,					// VkStructureType				sType;
			DE_NULL,											// const void*					pNext;
			"appName",											// const char*					pAppName;
			0u,													// deUint32						appVersion;
			"engineName",										// const char*					pEngineName;
			0u,													// deUint32						engineVersion;
			VK_MAKE_VERSION(1, 0, patchNumbers[patchVersion]),	// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// test when apiVersion is 0
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			"appName",								// const char*					pAppName;
			0u,										// deUint32						appVersion;
			"engineName",							// const char*					pEngineName;
			0u,										// deUint32						engineVersion;
			0u,										// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// run the tests!
	for (size_t appInfoNdx = 0; appInfoNdx < appInfos.size(); ++appInfoNdx)
	{
		const VkApplicationInfo&		appInfo					= appInfos[appInfoNdx];
		const VkInstanceCreateInfo		instanceCreateInfo		=
		{
			VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO,	// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			(VkInstanceCreateFlags)0u,				// VkInstanceCreateFlags		flags;
			&appInfo,								// const VkApplicationInfo*		pAppInfo;
			0u,										// deUint32						layerCount;
			DE_NULL,								// const char*const*			ppEnabledLayernames;
			0u,										// deUint32						extensionCount;
			DE_NULL,								// const char*const*			ppEnabledExtensionNames;
		};

		log << TestLog::Message << "Creating instance with appInfo: " << appInfo << TestLog::EndMessage;

		try
		{
			const Unique<VkInstance> instance(createInstance(platformInterface, &instanceCreateInfo));
			log << TestLog::Message << "Succeeded" << TestLog::EndMessage;
		}
		catch (const vk::Error& err)
		{
			resultCollector.fail("Failed, Error code: " + de::toString(err.getMessage()));
		}
	}

	return tcu::TestStatus(resultCollector.getResult(), resultCollector.getMessage());
}